

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::MultiNode<int,_QTextFrame_*>_>::freeData
          (Span<QHashPrivate::MultiNode<int,_QTextFrame_*>_> *this)

{
  byte bVar1;
  MultiNode<int,_QTextFrame_*> *pMVar2;
  MultiNode<int,_QTextFrame_*> *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  MultiNode<int,_QTextFrame_*> *local_18;
  
  if (*(long *)(in_RDI + 8) != 0) {
    pMVar2 = in_RDI + 8;
    for (local_18 = in_RDI; local_18 != pMVar2;
        local_18 = (MultiNode<int,_QTextFrame_*> *)((long)&local_18->key + 1)) {
      bVar1 = (byte)local_18->key;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)(*(long *)(in_RDI + 8) + (ulong)bVar1 * 0x10));
        MultiNode<int,_QTextFrame_*>::~MultiNode(in_RDI);
      }
    }
    if (*(void **)(in_RDI + 8) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
    *(undefined8 *)(in_RDI + 8) = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }